

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

bool __thiscall
spirv_cross::CompilerGLSL::subpass_input_is_framebuffer_fetch(CompilerGLSL *this,uint32_t id)

{
  pointer ppVar1;
  pointer ppVar2;
  bool bVar3;
  uint32_t uVar4;
  pointer ppVar5;
  
  bVar3 = Compiler::has_decoration(&this->super_Compiler,(ID)id,DecorationInputAttachmentIndex);
  if (bVar3) {
    uVar4 = Compiler::get_decoration(&this->super_Compiler,(ID)id,DecorationInputAttachmentIndex);
    ppVar1 = (this->subpass_to_framebuffer_fetch_attachment).
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (this->subpass_to_framebuffer_fetch_attachment).
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar1 != ppVar2) {
      do {
        ppVar5 = ppVar1 + 1;
        bVar3 = ppVar1->first == uVar4;
        if (bVar3) {
          return bVar3;
        }
        ppVar1 = ppVar5;
      } while (ppVar5 != ppVar2);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool CompilerGLSL::subpass_input_is_framebuffer_fetch(uint32_t id) const
{
	if (!has_decoration(id, DecorationInputAttachmentIndex))
		return false;

	uint32_t input_attachment_index = get_decoration(id, DecorationInputAttachmentIndex);
	for (auto &remap : subpass_to_framebuffer_fetch_attachment)
		if (remap.first == input_attachment_index)
			return true;

	return false;
}